

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenBoundingBoxesProcess.cpp
# Opt level: O3

void __thiscall utGenBoundingBoxesProcess::SetUp(utGenBoundingBoxesProcess *this)

{
  GenBoundingBoxesProcess *this_00;
  aiMesh *paVar1;
  aiVector3D *paVar2;
  long lVar3;
  aiScene *this_01;
  aiMesh **ppaVar4;
  uint i;
  long lVar5;
  float fVar6;
  
  this_00 = (GenBoundingBoxesProcess *)operator_new(0x18);
  Assimp::GenBoundingBoxesProcess::GenBoundingBoxesProcess(this_00);
  this->mProcess = this_00;
  paVar1 = (aiMesh *)operator_new(0x520);
  lVar5 = 0;
  paVar1->mPrimitiveTypes = 0;
  paVar1->mNumFaces = 0;
  memset(&paVar1->mVertices,0,0xcc);
  paVar1->mBones = (aiBone **)0x0;
  paVar1->mMaterialIndex = 0;
  (paVar1->mName).length = 0;
  (paVar1->mName).data[0] = '\0';
  memset((paVar1->mName).data + 1,0x1b,0x3ff);
  paVar1->mNumAnimMeshes = 0;
  paVar1->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar1->mMethod = 0;
  (paVar1->mAABB).mMin.x = 0.0;
  (paVar1->mAABB).mMin.y = 0.0;
  (paVar1->mAABB).mMin.z = 0.0;
  (paVar1->mAABB).mMax.x = 0.0;
  (paVar1->mAABB).mMax.y = 0.0;
  (paVar1->mAABB).mMax.z = 0.0;
  memset(paVar1->mColors,0,0xa0);
  this->mMesh = paVar1;
  paVar1->mNumVertices = 100;
  paVar2 = (aiVector3D *)operator_new__(0x4b0);
  memset(paVar2,0,0x4b0);
  paVar1->mVertices = paVar2;
  lVar3 = 8;
  do {
    fVar6 = (float)(int)lVar5;
    paVar2 = this->mMesh->mVertices;
    *(float *)((long)paVar2 + lVar3 + -8) = fVar6;
    *(float *)((long)paVar2 + lVar3 + -4) = fVar6;
    *(float *)((long)&paVar2->x + lVar3) = fVar6;
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 100);
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->mScene = this_01;
  this_01->mNumMeshes = 1;
  ppaVar4 = (aiMesh **)operator_new__(8);
  this_01->mMeshes = ppaVar4;
  *ppaVar4 = this->mMesh;
  return;
}

Assistant:

void SetUp() override {
        mProcess = new GenBoundingBoxesProcess;
        mMesh = new aiMesh();
        mMesh->mNumVertices = 100;
        mMesh->mVertices = new aiVector3D[100];
        for (unsigned int i = 0; i < 100; ++i) {
            mMesh->mVertices[i] = aiVector3D((ai_real)i, (ai_real)i, (ai_real)i);
        }
        mScene = new aiScene();
        mScene->mNumMeshes = 1;
        mScene->mMeshes = new aiMesh*[1];
        mScene->mMeshes[0] = mMesh;
    }